

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_remove(roaring_bitmap_t *r,uint32_t val)

{
  int iVar1;
  roaring_array_t *prVar2;
  roaring_array_t *ra;
  undefined4 in_ESI;
  roaring_array_t *in_RDI;
  container_t *container2;
  uint8_t newtypecode;
  container_t *container;
  uint8_t typecode;
  int i;
  uint16_t hb;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffce;
  uint8_t in_stack_ffffffffffffffcf;
  roaring_array_t *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  uint8_t typecode_00;
  uint8_t local_15;
  int32_t local_14;
  undefined2 local_e;
  roaring_array_t *local_8;
  
  local_e = (undefined2)((uint)in_ESI >> 0x10);
  local_8 = in_RDI;
  local_14 = ra_get_index((roaring_array_t *)
                          CONCAT17(in_stack_ffffffffffffffcf,
                                   CONCAT16(in_stack_ffffffffffffffce,
                                            CONCAT24(in_stack_ffffffffffffffcc,
                                                     in_stack_ffffffffffffffc8))),0);
  if (-1 < local_14) {
    ra_unshare_container_at_index
              (in_stack_ffffffffffffffd0,
               CONCAT11(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffce));
    prVar2 = (roaring_array_t *)ra_get_container_at_index(local_8,(uint16_t)local_14,&local_15);
    ra = (roaring_array_t *)
         container_remove((container_t *)CONCAT17(local_15,in_stack_ffffffffffffffd8),
                          (uint16_t)((ulong)in_stack_ffffffffffffffd0 >> 0x30),
                          (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x28),
                          (uint8_t *)
                          CONCAT17(in_stack_ffffffffffffffcf,
                                   CONCAT16(in_stack_ffffffffffffffce,
                                            CONCAT24(in_stack_ffffffffffffffcc,
                                                     in_stack_ffffffffffffffc8))));
    typecode_00 = local_15;
    if (ra != prVar2) {
      container_free(ra,in_stack_ffffffffffffffcf);
      ra_set_container_at_index(local_8,local_14,ra,local_15);
      typecode_00 = local_15;
    }
    iVar1 = container_get_cardinality
                      ((container_t *)
                       CONCAT17(in_stack_ffffffffffffffcf,
                                CONCAT16(in_stack_ffffffffffffffce,
                                         CONCAT24(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8))),'\0');
    if (iVar1 == 0) {
      ra_remove_at_index_and_free
                (ra,CONCAT13(in_stack_ffffffffffffffcf,
                             CONCAT12(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc)));
    }
    else {
      ra_set_container_at_index(local_8,local_14,ra,typecode_00);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
        if (container_get_cardinality(container2, newtypecode) != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }
    }
}